

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O1

void wolffstep<trng::yarn3s>(yarn3s *R,lattice *s,double T)

{
  int *piVar1;
  pointer piVar2;
  coord cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ret_t rVar12;
  queue<coord,_std::deque<coord,_std::allocator<coord>_>_> buffer;
  coord local_98;
  double local_90;
  _Deque_base<coord,_std::allocator<coord>_> local_88;
  double local_38;
  double local_30;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_90 = T;
  std::_Deque_base<coord,_std::allocator<coord>_>::_M_initialize_map(&local_88,0);
  local_30 = exp(-2.0 / local_90);
  local_38 = (double)s->L;
  local_98.x = 0;
  local_98.y = 0;
  rVar12 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R);
  local_98.x = (int)(rVar12 * 4.656658559636768e-10 * local_38);
  rVar12 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R);
  cVar3 = local_98;
  iVar4 = (int)(rVar12 * 4.656658559636768e-10 * local_38);
  local_98.y = iVar4;
  uVar10 = local_98.x;
  if (local_98.x < 0) {
    uVar9 = (ulong)cVar3 & 0xffffffff;
    do {
      uVar10 = (int)uVar9 + s->L;
      uVar9 = (ulong)uVar10;
    } while ((int)uVar10 < 0);
  }
  local_90 = 1.0 - local_30;
  iVar6 = s->L;
  iVar11 = uVar10 + iVar6;
  do {
    iVar11 = iVar11 - iVar6;
  } while (iVar6 <= iVar11);
  iVar5 = iVar4;
  if (iVar4 < 0) {
    iVar7 = iVar6 + iVar4;
    iVar5 = 0;
    if (0 < iVar7) {
      iVar5 = iVar7;
    }
    iVar5 = (((uint)(((iVar7 >> 0x1f) - iVar7) + iVar5) / (iVar6 + (uint)(iVar6 == 0)) -
             (iVar7 >> 0x1f)) + 1) * iVar6 + iVar4;
  }
  iVar5 = iVar5 + iVar6;
  iVar11 = iVar6 * iVar5 + iVar11;
  do {
    iVar11 = iVar11 - iVar6 * iVar6;
    iVar5 = iVar5 - iVar6;
  } while (iVar6 <= iVar5);
  piVar2 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar9 = (ulong)cVar3 & 0xffffffff;
  uVar10 = local_98.x;
  while ((int)uVar10 < 0) {
    uVar10 = (int)uVar9 + iVar6;
    uVar9 = (ulong)uVar10;
  }
  iVar11 = piVar2[iVar11];
  iVar5 = uVar10 + iVar6;
  do {
    iVar5 = iVar5 - iVar6;
  } while (iVar6 <= iVar5);
  if (iVar4 < 0) {
    iVar8 = iVar6 + iVar4;
    iVar7 = 0;
    if (0 < iVar8) {
      iVar7 = iVar8;
    }
    iVar4 = (((uint)(((iVar8 >> 0x1f) - iVar8) + iVar7) / (iVar6 + (uint)(iVar6 == 0)) -
             (iVar8 >> 0x1f)) + 1) * iVar6 + iVar4;
  }
  iVar4 = iVar4 + iVar6;
  iVar5 = iVar6 * iVar4 + iVar5;
  do {
    iVar5 = iVar5 - iVar6 * iVar6;
    iVar4 = iVar4 - iVar6;
  } while (iVar6 <= iVar4);
  piVar1 = piVar2 + iVar5;
  *piVar1 = -*piVar1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
              ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_98 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      cVar3 = local_98;
      iVar4 = local_98.x + -1;
      local_98.x = iVar4;
      if (iVar4 < 0) {
        do {
          iVar4 = iVar4 + s->L;
        } while (iVar4 < 0);
      }
      iVar6 = s->L;
      do {
        iVar5 = iVar4;
        iVar4 = iVar5 - iVar6;
      } while (iVar6 <= iVar5);
      iVar4 = local_98.y;
      if ((long)cVar3 < 0) {
        iVar7 = iVar6 + local_98.y;
        iVar4 = 0;
        if (0 < iVar7) {
          iVar4 = iVar7;
        }
        iVar4 = (((uint)(((iVar7 >> 0x1f) - iVar7) + iVar4) / (iVar6 + (uint)(iVar6 == 0)) -
                 (iVar7 >> 0x1f)) + 1) * iVar6 + local_98.y;
      }
      iVar4 = iVar4 + iVar6;
      iVar5 = iVar6 * iVar4 + iVar5;
      do {
        iVar5 = iVar5 - iVar6 * iVar6;
        iVar4 = iVar4 - iVar6;
      } while (iVar6 <= iVar4);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar12 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar12 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        if (local_98.x < 0) {
          uVar9 = (ulong)local_98 & 0xffffffff;
          do {
            uVar10 = (int)uVar9 + s->L;
            uVar9 = (ulong)uVar10;
          } while ((int)uVar10 < 0);
        }
        else {
          uVar9 = (ulong)local_98 & 0xffffffff;
        }
        iVar6 = local_98.y;
        iVar4 = s->L;
        do {
          iVar5 = (int)uVar9;
          uVar9 = (ulong)(uint)(iVar5 - iVar4);
        } while (iVar4 <= iVar5);
        if ((long)local_98 < 0) {
          iVar8 = iVar4 + iVar6;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          iVar6 = (((uint)(((iVar8 >> 0x1f) - iVar8) + iVar7) / (iVar4 + (uint)(iVar4 == 0)) -
                   (iVar8 >> 0x1f)) + 1) * iVar4 + iVar6;
        }
        iVar6 = iVar6 + iVar4;
        iVar5 = iVar4 * iVar6 + iVar5;
        do {
          iVar5 = iVar5 - iVar4 * iVar4;
          iVar6 = iVar6 - iVar4;
        } while (iVar4 <= iVar6);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      cVar3 = local_98;
      iVar4 = local_98.x + 2;
      local_98.x = iVar4;
      if (iVar4 < 0) {
        do {
          iVar4 = iVar4 + s->L;
        } while (iVar4 < 0);
      }
      iVar6 = s->L;
      do {
        iVar5 = iVar4;
        iVar4 = iVar5 - iVar6;
      } while (iVar6 <= iVar5);
      iVar4 = local_98.y;
      if ((long)cVar3 < 0) {
        iVar7 = iVar6 + local_98.y;
        iVar4 = 0;
        if (0 < iVar7) {
          iVar4 = iVar7;
        }
        iVar4 = (((uint)(((iVar7 >> 0x1f) - iVar7) + iVar4) / (iVar6 + (uint)(iVar6 == 0)) -
                 (iVar7 >> 0x1f)) + 1) * iVar6 + local_98.y;
      }
      iVar4 = iVar4 + iVar6;
      iVar5 = iVar6 * iVar4 + iVar5;
      do {
        iVar5 = iVar5 - iVar6 * iVar6;
        iVar4 = iVar4 - iVar6;
      } while (iVar6 <= iVar4);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar12 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar12 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        if (local_98.x < 0) {
          uVar9 = (ulong)local_98 & 0xffffffff;
          do {
            uVar10 = (int)uVar9 + s->L;
            uVar9 = (ulong)uVar10;
          } while ((int)uVar10 < 0);
        }
        else {
          uVar9 = (ulong)local_98 & 0xffffffff;
        }
        iVar6 = local_98.y;
        iVar4 = s->L;
        do {
          iVar5 = (int)uVar9;
          uVar9 = (ulong)(uint)(iVar5 - iVar4);
        } while (iVar4 <= iVar5);
        if ((long)local_98 < 0) {
          iVar8 = iVar4 + iVar6;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          iVar6 = (((uint)(((iVar8 >> 0x1f) - iVar8) + iVar7) / (iVar4 + (uint)(iVar4 == 0)) -
                   (iVar8 >> 0x1f)) + 1) * iVar4 + iVar6;
        }
        iVar6 = iVar6 + iVar4;
        iVar5 = iVar4 * iVar6 + iVar5;
        do {
          iVar5 = iVar5 - iVar4 * iVar4;
          iVar6 = iVar6 - iVar4;
        } while (iVar4 <= iVar6);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      iVar4 = local_98.y;
      local_98.x = local_98.x + -1;
      local_98.y = iVar4 + -1;
      iVar4 = local_98.x;
      if (local_98.x < 0) {
        do {
          iVar4 = iVar4 + s->L;
        } while (iVar4 < 0);
      }
      iVar6 = s->L;
      do {
        iVar5 = iVar4;
        iVar4 = iVar5 - iVar6;
      } while (iVar6 <= iVar5);
      iVar4 = local_98.y;
      if (local_98.y < 0) {
        iVar4 = iVar6 + local_98.y;
        iVar7 = 0;
        if (0 < iVar4) {
          iVar7 = iVar4;
        }
        iVar4 = (((uint)(((iVar4 >> 0x1f) - iVar4) + iVar7) / (iVar6 + (uint)(iVar6 == 0)) -
                 (iVar4 >> 0x1f)) + 1) * iVar6 + local_98.y;
      }
      iVar4 = iVar4 + iVar6;
      iVar5 = iVar6 * iVar4 + iVar5;
      do {
        iVar5 = iVar5 - iVar6 * iVar6;
        iVar4 = iVar4 - iVar6;
      } while (iVar6 <= iVar4);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar12 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar12 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        if (local_98.x < 0) {
          uVar9 = (ulong)local_98 & 0xffffffff;
          do {
            uVar10 = (int)uVar9 + s->L;
            uVar9 = (ulong)uVar10;
          } while ((int)uVar10 < 0);
        }
        else {
          uVar9 = (ulong)local_98 & 0xffffffff;
        }
        iVar6 = local_98.y;
        iVar4 = s->L;
        do {
          iVar5 = (int)uVar9;
          uVar9 = (ulong)(uint)(iVar5 - iVar4);
        } while (iVar4 <= iVar5);
        if ((long)local_98 < 0) {
          iVar8 = iVar4 + iVar6;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          iVar6 = (((uint)(((iVar8 >> 0x1f) - iVar8) + iVar7) / (iVar4 + (uint)(iVar4 == 0)) -
                   (iVar8 >> 0x1f)) + 1) * iVar4 + iVar6;
        }
        iVar6 = iVar6 + iVar4;
        iVar5 = iVar4 * iVar6 + iVar5;
        do {
          iVar5 = iVar5 - iVar4 * iVar4;
          iVar6 = iVar6 - iVar4;
        } while (iVar4 <= iVar6);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      cVar3 = local_98;
      iVar4 = local_98.y + 2;
      local_98.y = iVar4;
      if (local_98.x < 0) {
        uVar9 = (ulong)cVar3 & 0xffffffff;
        do {
          uVar10 = (int)uVar9 + s->L;
          uVar9 = (ulong)uVar10;
        } while ((int)uVar10 < 0);
      }
      else {
        uVar9 = (ulong)cVar3 & 0xffffffff;
      }
      iVar6 = s->L;
      do {
        iVar5 = (int)uVar9;
        uVar9 = (ulong)(uint)(iVar5 - iVar6);
      } while (iVar6 <= iVar5);
      if (iVar4 < 0) {
        iVar8 = iVar6 + iVar4;
        iVar7 = 0;
        if (0 < iVar8) {
          iVar7 = iVar8;
        }
        iVar4 = (((uint)(((iVar8 >> 0x1f) - iVar8) + iVar7) / (iVar6 + (uint)(iVar6 == 0)) -
                 (iVar8 >> 0x1f)) + 1) * iVar6 + iVar4;
      }
      iVar4 = iVar4 + iVar6;
      iVar5 = iVar6 * iVar4 + iVar5;
      do {
        iVar5 = iVar5 - iVar6 * iVar6;
        iVar4 = iVar4 - iVar6;
      } while (iVar6 <= iVar4);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar12 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar12 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        if (local_98.x < 0) {
          uVar9 = (ulong)local_98 & 0xffffffff;
          do {
            uVar10 = (int)uVar9 + s->L;
            uVar9 = (ulong)uVar10;
          } while ((int)uVar10 < 0);
        }
        else {
          uVar9 = (ulong)local_98 & 0xffffffff;
        }
        iVar6 = local_98.y;
        iVar4 = s->L;
        do {
          iVar5 = (int)uVar9;
          uVar9 = (ulong)(uint)(iVar5 - iVar4);
        } while (iVar4 <= iVar5);
        if ((long)local_98 < 0) {
          iVar8 = iVar4 + iVar6;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          iVar6 = (((uint)(((iVar8 >> 0x1f) - iVar8) + iVar7) / (iVar4 + (uint)(iVar4 == 0)) -
                   (iVar8 >> 0x1f)) + 1) * iVar4 + iVar6;
        }
        iVar6 = iVar6 + iVar4;
        iVar5 = iVar4 * iVar6 + iVar5;
        do {
          iVar5 = iVar5 - iVar4 * iVar4;
          iVar6 = iVar6 - iVar4;
        } while (iVar4 <= iVar6);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      local_98.y = local_98.y + -1;
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<coord,_std::allocator<coord>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void wolffstep(RNG_type &R, lattice &s, double T) {
  std::queue<coord> buffer;
  const double padd = 1.0 - std::exp(-2.0 / T);

  trng::uniform_int_dist U(0, s.size());
  trng::bernoulli_dist<bool> B(padd, true, false);
  coord r;

  r.x = U(R);
  r.y = U(R);
  const int oldspin{s.get(r)};
  s.flipp(r);
  buffer.push(r);
  while (!buffer.empty()) {
    r = buffer.front();
    buffer.pop();
    --r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.x;
    ++r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.x;
    --r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.y;
    ++r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.y;
  }
}